

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

DTLSSentRecord * __thiscall
bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>::operator[]
          (MRUQueue<bssl::DTLSSentRecord,_32UL> *this,size_t i)

{
  size_t sVar1;
  DTLSSentRecord *pDVar2;
  size_t i_local;
  MRUQueue<bssl::DTLSSentRecord,_32UL> *this_local;
  
  sVar1 = size(this);
  if (sVar1 <= i) {
    abort();
  }
  pDVar2 = InplaceVector<bssl::DTLSSentRecord,_32UL>::operator[]
                     (&this->storage_,this->start_ + i & 0x1f);
  return pDVar2;
}

Assistant:

T &operator[](size_t i) {
    BSSL_CHECK(i < size());
    return storage_[(start_ + i) % N];
  }